

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

void generate_SSA(map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *nodes,map<mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                         *global,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom_f,vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *vars,
                 map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  _Rb_tree_color _Var1;
  long lVar2;
  BasicBlock *b;
  _Rb_tree_header *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this;
  _Rb_tree_node_base *p_Var6;
  pointer pVVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  _Self __tmp;
  _Base_ptr p_Var12;
  long lVar13;
  _Rb_tree_color *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar15;
  _Rb_tree_header *p_Var16;
  bool bVar17;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dom_tree;
  shared_ptr<mir::inst::PhiInst> irphi_1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> varset;
  shared_ptr<mir::inst::PhiInst> irphi;
  map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  phi;
  _Deque_base<int,_std::allocator<int>_> local_298;
  _Base_ptr local_240;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_238;
  _Rb_tree_node_base *local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_210;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_1e0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *local_1b0;
  _Rb_tree_node_base *local_1a8;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_1a0;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_188;
  VarId local_170;
  undefined **local_160;
  uint32_t local_158;
  undefined **local_150;
  undefined4 local_148;
  undefined **local_140;
  undefined4 local_138;
  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  local_130;
  VarId local_100;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_f0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  local_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_130._M_impl.super__Rb_tree_header._M_header;
  local_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = (global->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a8 = &(global->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_238 = dom_f;
  local_1b0 = &dom->_M_t;
  local_130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_130._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var6 != local_1a8) {
    local_240 = &(dom_f->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = &(nodes->_M_t)._M_impl.super__Rb_tree_header;
    do {
      local_298._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_298._M_impl.super__Deque_impl_data._M_map_size = 0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_298,0);
      for (p_Var4 = p_Var6[2]._M_parent; p_Var4 != (_Rb_tree_node_base *)&p_Var6[1]._M_right;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                    ((deque<int,std::allocator<int>> *)&local_298,(int *)(p_Var4 + 1));
        }
        else {
          *local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = p_Var4[1]._M_color;
          local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((_Rb_tree_color *)local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + 1);
        }
      }
      if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_298._M_impl.super__Deque_impl_data._M_start._M_cur) {
        local_230 = p_Var6 + 1;
        do {
          _Var1 = *local_298._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_298._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_298._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_298._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_298._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_298._M_impl.super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 ((_Rb_tree_color *)local_298._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80)
            ;
            local_298._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_298._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_298._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_298._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          p_Var5 = local_240;
          for (p_Var12 = (local_238->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var12 != (_Base_ptr)0x0;
              p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < (int)_Var1]) {
            if ((int)_Var1 <= (int)p_Var12[1]._M_color) {
              p_Var5 = p_Var12;
            }
          }
          p_Var12 = local_240;
          if ((p_Var5 != local_240) && (p_Var12 = p_Var5, (int)_Var1 < (int)p_Var5[1]._M_color)) {
            p_Var12 = local_240;
          }
          if ((p_Var12 != local_240) &&
             (p_Var5 = p_Var12[1]._M_parent, p_Var12[1]._M_left != p_Var5)) {
            uVar15 = 0;
            do {
              p_Var9 = &local_130._M_impl.super__Rb_tree_header;
              p_Var8 = &p_Var9->_M_header;
              if (local_130._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                p_Var10 = local_130._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  if ((int)(&p_Var5->_M_color)[uVar15] <= (int)*(size_t *)(p_Var10 + 1)) {
                    p_Var8 = p_Var10;
                  }
                  p_Var10 = (&p_Var10->_M_left)
                            [(int)*(size_t *)(p_Var10 + 1) < (int)(&p_Var5->_M_color)[uVar15]];
                } while (p_Var10 != (_Base_ptr)0x0);
              }
              p_Var16 = p_Var9;
              if (((_Rb_tree_header *)p_Var8 != p_Var9) &&
                 (p_Var16 = (_Rb_tree_header *)p_Var8,
                 (int)(&p_Var5->_M_color)[uVar15] < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)
                 ) {
                p_Var16 = p_Var9;
              }
              _Var1 = (&p_Var5->_M_color)[uVar15];
              if (-1 < (int)_Var1) {
                if (p_Var16 == p_Var9) {
                  p_Var5 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var8 = &p_Var3->_M_header;
                  for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                      p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < (int)_Var1]) {
                    if ((int)_Var1 <= (int)*(size_t *)(p_Var5 + 1)) {
                      p_Var8 = p_Var5;
                    }
                  }
                  p_Var9 = p_Var3;
                  if (((_Rb_tree_header *)p_Var8 != p_Var3) &&
                     (p_Var9 = (_Rb_tree_header *)p_Var8,
                     (int)_Var1 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
                    p_Var9 = p_Var3;
                  }
                  local_140 = &PTR_display_001ee058;
                  local_138 = *(undefined4 *)&p_Var6[1]._M_parent;
                  ir_phi((VarId *)local_228,(int)&local_140);
                  lVar13 = *(long *)(p_Var9 + 1);
                  lVar2 = *(long *)(lVar13 + 8);
                  local_218 = (undefined1  [8])local_228._0_8_;
                  local_210._M_impl._0_8_ = local_228._8_8_;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)(local_228._8_8_ + 8) =
                           *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)(local_228._8_8_ + 8) =
                           *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
                    }
                  }
                  local_210._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
                  std::
                  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                  ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                    *)(lVar13 + 8),
                                   (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                    *)(lVar2 + 0x18),(value_type *)local_218);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                    ::_S_vtable._M_arr
                    [(byte)(undefined1)local_210._M_impl.super__Rb_tree_header._M_header._M_color].
                    _M_data)((anon_class_1_0_00000001 *)&local_1e0,
                             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                              *)local_218);
                  local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  local_1e0._M_impl.super__Rb_tree_header._M_header._M_left =
                       &local_1e0._M_impl.super__Rb_tree_header._M_header;
                  local_1e0._M_impl.super__Rb_tree_header._M_node_count = 0;
                  local_1e0._M_impl.super__Rb_tree_header._M_header._M_right =
                       local_1e0._M_impl.super__Rb_tree_header._M_header._M_left;
                  std::
                  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  ::_M_insert_unique<mir::inst::VarId_const&>
                            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                              *)&local_1e0,(VarId *)local_230);
                  local_218._0_4_ = (&(p_Var12[1]._M_parent)->_M_color)[uVar15];
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::_Rb_tree(&local_210,&local_1e0);
                  std::
                  _Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
                  ::
                  _M_insert_unique<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>
                            ((_Rb_tree<int,std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>,std::_Select1st<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>>>
                              *)&local_130,
                             (pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                              *)local_218);
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::~_Rb_tree(&local_210);
                  p_Var14 = &(p_Var12[1]._M_parent)->_M_color + uVar15;
                  if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                              ((deque<int,std::allocator<int>> *)&local_298,(int *)p_Var14);
                  }
                  else {
                    *local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = *p_Var14;
                    local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::~_Rb_tree(&local_1e0);
                  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
                }
                else {
                  lVar13 = *(long *)((long)(p_Var16 + 1) + 0x10);
                  lVar2 = (long)(p_Var16 + 1) + 8;
                  lVar11 = lVar2;
                  if (lVar13 != 0) {
                    do {
                      bVar17 = *(uint *)(lVar13 + 0x28) < *(uint *)&p_Var6[1]._M_parent;
                      if (!bVar17) {
                        lVar11 = lVar13;
                      }
                      lVar13 = *(long *)(lVar13 + 0x10 + (ulong)bVar17 * 8);
                    } while (lVar13 != 0);
                  }
                  lVar13 = lVar2;
                  if ((lVar11 != lVar2) &&
                     (lVar13 = lVar11, *(uint *)&p_Var6[1]._M_parent < *(uint *)(lVar11 + 0x28))) {
                    lVar13 = lVar2;
                  }
                  if (lVar13 != lVar2) goto LAB_00197853;
                  p_Var5 = (nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var8 = &p_Var3->_M_header;
                  for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                      p_Var5 = (&p_Var5->_M_left)[(int)*(size_t *)(p_Var5 + 1) < (int)_Var1]) {
                    if ((int)_Var1 <= (int)*(size_t *)(p_Var5 + 1)) {
                      p_Var8 = p_Var5;
                    }
                  }
                  p_Var9 = p_Var3;
                  if (((_Rb_tree_header *)p_Var8 != p_Var3) &&
                     (p_Var9 = (_Rb_tree_header *)p_Var8,
                     (int)_Var1 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
                    p_Var9 = p_Var3;
                  }
                  local_150 = &PTR_display_001ee058;
                  local_148 = *(undefined4 *)&p_Var6[1]._M_parent;
                  ir_phi((VarId *)&local_1e0,(int)&local_150);
                  lVar13 = *(long *)(p_Var9 + 1);
                  lVar2 = *(long *)(lVar13 + 8);
                  local_210._M_impl._0_8_ =
                       CONCAT44(local_1e0._M_impl.super__Rb_tree_header._M_header._4_4_,
                                local_1e0._M_impl.super__Rb_tree_header._M_header._M_color);
                  local_218 = (undefined1  [8])local_1e0._M_impl._0_8_;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_210._M_impl._0_8_)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_impl._0_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_210._M_impl._0_8_)->_M_use_count + 1;
                    }
                  }
                  local_210._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
                  std::
                  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                  ::_M_insert_rval((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                    *)(lVar13 + 8),
                                   (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                    *)(lVar2 + 0x18),(value_type *)local_218);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
                    ::_S_vtable._M_arr
                    [(byte)(undefined1)local_210._M_impl.super__Rb_tree_header._M_header._M_color].
                    _M_data)((anon_class_1_0_00000001 *)local_228,
                             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                              *)local_218);
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              *)local_218,
                             (_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                              *)(p_Var16 + 1));
                  std::
                  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  ::_M_insert_unique<mir::inst::VarId_const&>
                            ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                              *)local_218,(VarId *)local_230);
                  this = &std::
                          map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                          ::operator[]((map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                                        *)&local_130,
                                       (key_type *)(&(p_Var12[1]._M_parent)->_M_color + uVar15))->
                          _M_t;
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::operator=(this,(_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                    *)local_218);
                  p_Var14 = &(p_Var12[1]._M_parent)->_M_color + uVar15;
                  if (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_298._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                              ((deque<int,std::allocator<int>> *)&local_298,(int *)p_Var14);
                  }
                  else {
                    *local_298._M_impl.super__Deque_impl_data._M_finish._M_cur = *p_Var14;
                    local_298._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_298._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  std::
                  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                               *)local_218);
                  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT44(local_1e0._M_impl.super__Rb_tree_header._M_header._4_4_,
                                     local_1e0._M_impl.super__Rb_tree_header._M_header._M_color);
                }
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
              }
LAB_00197853:
              uVar15 = uVar15 + 1;
              p_Var5 = p_Var12[1]._M_parent;
            } while (uVar15 < (ulong)((long)p_Var12[1]._M_left - (long)p_Var5 >> 2));
          }
        } while (local_298._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 local_298._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_298);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_1a8);
  }
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_188,vars);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector(&local_1a0,&notRename);
  vectors_difference((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&local_298,
                     &local_188,&local_1a0);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_move_assign(vars,&local_298);
  if (local_298._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_298._M_impl.super__Deque_impl_data._M_map,
                    (long)local_298._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_298._M_impl.super__Deque_impl_data._M_map);
  }
  if (local_1a0.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&local_c0,local_1b0);
  build_dom_tree((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_298,
                 (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 &local_c0);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_c0);
  pVVar7 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar7) {
    p_Var3 = &local_f0._M_impl.super__Rb_tree_header;
    uVar15 = 0;
    do {
      if (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_start) {
        V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      local_160 = &PTR_display_001ee058;
      local_158 = pVVar7[uVar15].id;
      rename((char *)&local_100,(char *)&local_160);
      push(&local_100);
      local_170.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
      local_170.id = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].id;
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::_Rb_tree(&local_f0,&nodes->_M_t);
      p_Var5 = &p_Var3->_M_header;
      for (p_Var12 = local_f0._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var12 != (_Rb_tree_header *)0x0;
          p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < -1]) {
        if (-2 < (int)*(size_t *)(p_Var12 + 1)) {
          p_Var5 = p_Var12;
        }
      }
      p_Var9 = p_Var3;
      if (((_Rb_tree_header *)p_Var5 != p_Var3) &&
         (p_Var9 = (_Rb_tree_header *)p_Var5, -1 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count))
      {
        p_Var9 = p_Var3;
      }
      b = *(BasicBlock **)(p_Var9 + 1);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::_Rb_tree(&local_60,&nodes->_M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_298);
      rename_var(&local_170,b,
                 (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                  *)&local_60,
                 (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
      ::~_Rb_tree(&local_f0);
      uVar15 = uVar15 + 1;
      pVVar7 = (vars->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(vars->
                                    super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >> 4)
            );
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_298);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~_Rb_tree(&local_130);
  return;
}

Assistant:

void generate_SSA(map<int, BasicBlock*> nodes,
                  map<mir::inst::VarId, set<int>> global,
                  map<int, vector<int>> dom_f, vector<mir::inst::VarId> vars,
                  map<int, int> dom) {
  map<mir::inst::VarId, set<int>>::iterator it;
  map<int, set<mir::inst::VarId>> phi;
  for (it = global.begin(); it != global.end(); it++) {
    queue<int> q;
    set<int>::iterator s;
    for (s = it->second.begin(); s != it->second.end(); s++) {
      q.push(*s);
    }
    while (!q.empty()) {
      int b = q.front();
      q.pop();
      map<int, vector<int>>::iterator itt = dom_f.find(b);
      if (itt != dom_f.end()) {
        for (int i = 0; i < itt->second.size(); i++) {
          map<int, set<mir::inst::VarId>>::iterator iter =
              phi.find(itt->second[i]);
          if (itt->second[i] >= 0) {
            if (iter == phi.end()) {
              map<int, BasicBlock*>::iterator itera =
                  nodes.find(itt->second[i]);
              shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
              //(*irphi).display(cout);
              itera->second->inst.insert(itera->second->inst.begin() + 1,
                                         irphi);
              set<mir::inst::VarId> varset;
              varset.insert(it->first);
              phi.insert(map<int, set<mir::inst::VarId>>::value_type(
                  itt->second[i], varset));
              q.push(itt->second[i]);
            } else {
              set<mir::inst::VarId>::iterator ss;
              ss = iter->second.find(it->first);
              if (ss == iter->second.end()) {
                map<int, BasicBlock*>::iterator itera =
                    nodes.find(itt->second[i]);
                shared_ptr<mir::inst::PhiInst> irphi = ir_phi(it->first, 0);
                //(*irphi).display(cout);
                itera->second->inst.insert(itera->second->inst.begin() + 1,
                                           irphi);
                set<mir::inst::VarId> varset = iter->second;
                varset.insert(it->first);
                phi[itt->second[i]] = varset;
                q.push(itt->second[i]);
              }
            }
          }
        }
      }
    }
  }

  // step3: number the vars, don't rename the $0(return value)
  vars = vectors_difference(vars, notRename);
  map<int, vector<int>> dom_tree = build_dom_tree(dom);
  for (int i = 0; i < vars.size(); i++) {
    V.clear();
    push(rename(vars[i]));
    rename_var(vars[i], find_entry(nodes), nodes, dom_tree);
  }
}